

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  ImDrawList *pIVar9;
  char *pcVar10;
  uint uVar11;
  char *pcVar12;
  ulong uVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  ImVec2 local_88;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if (window != (ImGuiWindow *)0x0) {
    bVar8 = window->WasActive;
    pIVar5 = GImGui->NavWindow;
    if (bVar8 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar14 = " *Inactive*";
    }
    else {
      pcVar14 = "";
    }
    bVar6 = TreeNodeEx(label,(uint)(pIVar5 == window),"%s \'%s\'%s",label,window->Name,pcVar14);
    if (bVar8 == false) {
      PopStyleColor(1);
    }
    bVar7 = IsItemHovered(0);
    if ((bVar7 & bVar8) == 1) {
      pIVar9 = GetForegroundDrawList();
      local_88.y = (window->Pos).y + (window->Size).y;
      local_88.x = (window->Pos).x + (window->Size).x;
      ImDrawList::AddRect(pIVar9,&window->Pos,&local_88,0xff00ffff,0.0,0,1.0);
    }
    if (bVar6) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar11 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 SUB84((double)(window->Pos).x,0),SUB84((double)(window->Pos).y,0),
                 SUB84((double)(window->Size).x,0),SUB84((double)(window->Size).y,0),
                 (double)(window->ContentSize).x,(double)(window->ContentSize).y,
                 (double)(window->ContentSizeIdeal).x,(double)(window->ContentSizeIdeal).y);
      pcVar14 = "Child ";
      if ((uVar11 >> 0x18 & 1) == 0) {
        pcVar14 = "";
      }
      pcVar10 = "Tooltip ";
      if ((uVar11 >> 0x19 & 1) == 0) {
        pcVar10 = "";
      }
      pcVar12 = "Popup ";
      if ((uVar11 >> 0x1a & 1) == 0) {
        pcVar12 = "";
      }
      pcVar15 = "Modal ";
      if ((uVar11 >> 0x1b & 1) == 0) {
        pcVar15 = "";
      }
      pcVar16 = "ChildMenu ";
      if ((uVar11 >> 0x1c & 1) == 0) {
        pcVar16 = "";
      }
      pcVar17 = "NoSavedSettings ";
      if ((uVar11 >> 8 & 1) == 0) {
        pcVar17 = "";
      }
      pcVar20 = "NoMouseInputs";
      if ((uVar11 >> 9 & 1) == 0) {
        pcVar20 = "";
      }
      pcVar18 = "NoNavInputs";
      if ((uVar11 >> 0x12 & 1) == 0) {
        pcVar18 = "";
      }
      pcVar19 = "AlwaysAutoResize";
      if ((uVar11 & 0x40) == 0) {
        pcVar19 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar11,pcVar14,pcVar10,pcVar12,
                 pcVar15,pcVar16,pcVar17,pcVar20,pcVar18,pcVar19);
      pcVar14 = "X";
      if (window->ScrollbarX == false) {
        pcVar14 = "";
      }
      pcVar10 = "Y";
      if (window->ScrollbarY == false) {
        pcVar10 = "";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",SUB84((double)(window->Scroll).x,0),
                 SUB84((double)(window->ScrollMax).x,0),SUB84((double)(window->Scroll).y,0),
                 SUB84((double)(window->ScrollMax).y,0),pcVar14,pcVar10);
      if ((window->Active != false) || (uVar13 = 0xffffffff, window->WasActive != false)) {
        uVar13 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar13)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      lVar21 = 0x388;
      uVar11 = 0;
      do {
        fVar1 = *(float *)((long)window + lVar21 * 4 + -0xa90);
        fVar2 = *(float *)((long)window + lVar21 * 4 + -0xa8c);
        fVar3 = *(float *)((long)window + lVar21 * 4 + -0xa88);
        fVar4 = *(float *)((long)window + lVar21 * 4 + -0xa84);
        if ((fVar1 < fVar4) || (fVar2 < fVar4)) {
          local_78 = ZEXT416((uint)fVar1);
          local_58 = ZEXT416((uint)fVar2);
          local_68 = ZEXT416((uint)fVar3);
          local_48 = ZEXT416((uint)fVar4);
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",SUB84((double)fVar1,0),
                     SUB84((double)fVar2,0),SUB84((double)fVar3,0),SUB84((double)fVar4,0),
                     (ulong)uVar11,(ulong)*(uint *)((long)&window->Name + lVar21));
          bVar8 = IsItemHovered(0);
          if (bVar8) {
            pIVar9 = GetForegroundDrawList();
            fVar1 = (window->Pos).x;
            fVar2 = (window->Pos).y;
            local_88.y = (float)local_58._0_4_ + fVar2;
            local_88.x = (float)local_78._0_4_ + fVar1;
            local_80.y = (float)local_48._0_4_ + fVar2;
            local_80.x = (float)local_68._0_4_ + fVar1;
            ImDrawList::AddRect(pIVar9,&local_88,&local_80,0xff00ffff,0.0,0,1.0);
          }
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)uVar11,
                     (ulong)*(uint *)((long)&window->Name + lVar21));
        }
        lVar21 = lVar21 + 4;
        uVar11 = uVar11 + 1;
      } while (lVar21 == 0x38c);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar14 = "NULL";
      }
      else {
        pcVar14 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar14);
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar8 = TreeNode("Columns","Columns sets (%d)");
        if (bVar8) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar21 = 0;
            lVar22 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar21));
              lVar22 = lVar22 + 1;
              lVar21 = lVar21 + 0x88;
            } while (lVar22 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
        {
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
            continue;
        }
        BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        if (IsItemHovered())
            GetForegroundDrawList(window)->AddRect(r.Min + window->Pos, r.Max + window->Pos, IM_COL32(255, 255, 0, 255));
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}